

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

void soul::emitMessage(CompileMessage *m)

{
  long lVar1;
  long in_FS_OFFSET;
  CompileMessageGroup messageGroup;
  undefined1 local_100 [248];
  
  local_100._0_8_ = local_100 + 0x18;
  local_100._8_8_ = 0;
  local_100._16_8_ = 4;
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_100,m);
  lVar1 = *(long *)(in_FS_OFFSET + -8);
  if (lVar1 != 0) {
    if (*(long *)(lVar1 + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(lVar1 + 0x18))(lVar1,local_100);
  }
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::clear
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_100);
  return;
}

Assistant:

void emitMessage (CompileMessage m)
{
    CompileMessageGroup messageGroup;
    messageGroup.messages.push_back (std::move (m));
    emitMessage (messageGroup);
}